

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cc
# Opt level: O3

unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
bssl::VerifyTrustStore::FromDER(string_view der_certs,string *out_diagnostic)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TrustStoreInMemory *this;
  undefined8 *puVar4;
  long *plVar5;
  string *in_RCX;
  ulong uVar6;
  element_type *peVar7;
  char cVar8;
  uchar *puVar9;
  tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_> tVar10;
  string *in_R8;
  ulong __val;
  Span<const_unsigned_char> cert_00;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> *ret;
  CBS cbs;
  string __str;
  CBS cert;
  _Storage<std::shared_ptr<const_bssl::ParsedCertificate>,_false> local_a0;
  undefined1 local_90 [80];
  CBS local_40;
  
  puVar9 = (uchar *)der_certs._M_str;
  tVar10.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
       der_certs._M_len;
  this = (TrustStoreInMemory *)operator_new(0x70);
  TrustStoreInMemory::TrustStoreInMemory(this);
  local_90._32_8_ = out_diagnostic;
  local_90._40_8_ = puVar9;
  if (puVar9 != (uchar *)0x0) {
    __val = 1;
    do {
      iVar3 = CBS_get_asn1_element((CBS *)(local_90 + 0x20),&local_40,0x20000010);
      if (iVar3 == 0) {
        cVar8 = '\x01';
        if (__val < 10) goto LAB_004b3505;
        uVar6 = __val;
        cVar2 = '\x04';
        goto LAB_004b34c8;
      }
      cert_00.size_ = (size_t)in_RCX;
      cert_00.data_ = (uchar *)local_40.len;
      anon_unknown_19::InternalParseCertificate
                ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)&local_a0._M_value,
                 (anon_unknown_19 *)local_40.data,cert_00,in_R8);
      cVar8 = local_90[0];
      if (local_90[0] == '\0') {
        *(undefined8 *)
         tVar10.
         super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
         .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = 0;
      }
      else {
        local_90._16_8_ =
             local_a0._M_value.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_90._24_8_ =
             local_a0._M_value.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_a0._M_value.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_a0._M_value.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_a0._M_value.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_a0._M_value.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_a0._M_value.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) + 1;
          }
        }
        TrustStoreInMemory::AddTrustAnchor
                  (this,(shared_ptr<const_bssl::ParsedCertificate> *)(local_90 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_);
        }
      }
      if ((local_90[0] == '\x01') &&
         (local_a0._M_value.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0._M_value.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (cVar8 == '\0') goto LAB_004b35d5;
      __val = __val + 1;
    } while ((uchar *)local_90._40_8_ != (uchar *)0x0);
  }
  puVar4 = (undefined8 *)operator_new(8);
  *(undefined8 **)
   tVar10.
   super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
   super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = puVar4;
  *puVar4 = this;
  return (__uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
          )(tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
           tVar10.
           super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
           .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
LAB_004b34c8:
  cVar8 = cVar2;
  if (uVar6 < 100) {
    cVar8 = cVar8 + -2;
    goto LAB_004b3505;
  }
  if (uVar6 < 1000) {
    cVar8 = cVar8 + -1;
    goto LAB_004b3505;
  }
  if (uVar6 < 10000) goto LAB_004b3505;
  bVar1 = uVar6 < 100000;
  uVar6 = uVar6 / 10000;
  cVar2 = cVar8 + '\x04';
  if (bVar1) {
    cVar8 = cVar8 + '\x01';
LAB_004b3505:
    local_90._48_8_ = local_90 + 0x40;
    ::std::__cxx11::string::_M_construct((ulong)(local_90 + 0x30),cVar8);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_90._48_8_,local_90._56_4_,__val);
    plVar5 = (long *)::std::__cxx11::string::replace
                               ((ulong)(local_90 + 0x30),0,(char *)0x0,0x599fd2);
    peVar7 = (element_type *)(plVar5 + 2);
    if ((element_type *)*plVar5 == peVar7) {
      local_90._0_8_ =
           (peVar7->cert_data_)._M_t.
           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      local_90._8_8_ = plVar5[3];
      local_a0._M_value.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_90;
    }
    else {
      local_90._0_8_ =
           (peVar7->cert_data_)._M_t.
           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      local_a0._M_value.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar5;
    }
    local_a0._M_value.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (__shared_count<(__gnu_cxx::_Lock_policy)2>)plVar5[1];
    *plVar5 = (long)peVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::operator=(in_RCX,(string *)&local_a0._M_value);
    if (local_a0._M_value.
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_90) {
      operator_delete(local_a0._M_value.
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(ulong)(local_90._0_8_ + 1));
    }
    if ((undefined1 *)local_90._48_8_ != local_90 + 0x40) {
      operator_delete((void *)local_90._48_8_,local_90._64_8_ + 1);
    }
    *(undefined8 *)
     tVar10.
     super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
     super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = 0;
LAB_004b35d5:
    (*(this->super_TrustStore).super_CertIssuerSource._vptr_CertIssuerSource[1])();
    return (__uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
            )(tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
             tVar10.
             super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
             .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  }
  goto LAB_004b34c8;
}

Assistant:

std::unique_ptr<VerifyTrustStore> VerifyTrustStore::FromDER(
    std::string_view der_certs, std::string *out_diagnostic) {
  auto store = std::make_unique<TrustStoreInMemory>();
  CBS cbs = StringAsBytes(der_certs);

  for (size_t cert_num = 1; CBS_len(&cbs) != 0; cert_num++) {
    CBS cert;
    if (!CBS_get_asn1_element(&cbs, &cert, CBS_ASN1_SEQUENCE)) {
      *out_diagnostic = "failed to get ASN.1 SEQUENCE from input at cert " +
                        std::to_string(cert_num);
      return {};
    }

    auto parsed_cert = InternalParseCertificate(cert, out_diagnostic);
    if (!parsed_cert.has_value()) {
      return {};
    }
    store->AddTrustAnchor(parsed_cert.value());
  }

  return WrapTrustStore(std::move(store));
}